

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

void WrapLine(TidyDocImpl *doc)

{
  uint *puVar1;
  int iVar2;
  Bool BVar3;
  uint uVar4;
  ulong uVar5;
  
  if ((doc->pprint).wraphere != 0) {
    BVar3 = WantIndent(doc);
    if ((BVar3 == no) || (WriteIndentChar(doc), (doc->pprint).wraphere != 0)) {
      uVar5 = 0;
      do {
        prvTidyWriteChar((doc->pprint).linebuf[uVar5],doc->docOut);
        uVar5 = uVar5 + 1;
        uVar4 = (doc->pprint).wraphere;
      } while (uVar5 < uVar4);
    }
    else {
      uVar4 = 0;
    }
    iVar2 = (doc->pprint).indent[0].attrStringStart;
    if ((iVar2 == 0) || (iVar2 < (int)uVar4 && 0 < iVar2)) {
      prvTidyWriteChar(0x5c,doc->docOut);
    }
    prvTidyWriteChar(10,doc->docOut);
    puVar1 = &(doc->pprint).line;
    *puVar1 = *puVar1 + 1;
    ResetLineAfterWrap(&doc->pprint);
    return;
  }
  return;
}

Assistant:

static void WrapLine( TidyDocImpl* doc )
{
    TidyPrintImpl* pprint = &doc->pprint;
    uint i;

    if ( pprint->wraphere == 0 )
        return;

    if ( WantIndent(doc) )
        WriteIndentChar(doc);

    for ( i = 0; i < pprint->wraphere; ++i )
        TY_(WriteChar)( pprint->linebuf[i], doc->docOut );

    if ( IsWrapInString(pprint) )
        TY_(WriteChar)( '\\', doc->docOut );

    TY_(WriteChar)( '\n', doc->docOut );
    pprint->line++;
    ResetLineAfterWrap( pprint );
}